

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O0

void EMIT_OP_REG_NUM(CodeGenGenericContext *ctx,x86Command op,x86Reg reg1,uint num)

{
  x86Argument arg;
  x86Argument local_40;
  uint local_1c;
  x86Reg local_18;
  uint num_local;
  x86Reg reg1_local;
  x86Command op_local;
  CodeGenGenericContext *ctx_local;
  
  num_local = op;
  if (op == o_movsx) {
    num_local = 1;
  }
  local_1c = num;
  local_18 = reg1;
  _reg1_local = ctx;
  switch(num_local) {
  case 1:
    if ((ctx->genReg[reg1].type == argNumber) && (ctx->genReg[reg1].field_1.reg == num)) {
      ctx->optimizationCount = ctx->optimizationCount + 1;
      return;
    }
    x86Argument::x86Argument(&local_40,num);
    arg.field_1.imm64Arg = local_40.field_1.imm64Arg;
    arg.type = local_40.type;
    arg._4_4_ = local_40._4_4_;
    arg.ptrBase = local_40.ptrBase;
    arg.ptrIndex = local_40.ptrIndex;
    arg.ptrMult = local_40.ptrMult;
    arg.ptrNum = local_40.ptrNum;
    CodeGenGenericContext::OverwriteRegisterWithValue(ctx,reg1,arg);
    break;
  default:
    __assert_fail("!\"unknown instruction\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                  ,0x484,
                  "void EMIT_OP_REG_NUM(CodeGenGenericContext &, x86Command, x86Reg, unsigned int)")
    ;
  case 0x1d:
  case 0x1f:
  case 0x4f:
  case 0x50:
    if (reg1 != rESP) {
      CodeGenGenericContext::ReadAndModifyRegister(ctx,reg1);
    }
    break;
  case 0x1e:
  case 0x20:
  case 0x21:
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x27:
  case 0x28:
  case 0x29:
  case 0x51:
  case 0x53:
  case 0x54:
  case 0x56:
  case 0x57:
  case 0x58:
    CodeGenGenericContext::ReadAndModifyRegister(ctx,reg1);
    break;
  case 0x2a:
  case 0x59:
    CodeGenGenericContext::ReadRegister(ctx,reg1);
  }
  _reg1_local->x86Op->name = num_local;
  (_reg1_local->x86Op->argA).type = argReg;
  (_reg1_local->x86Op->argA).field_1.reg = local_18;
  (_reg1_local->x86Op->argB).type = argNumber;
  (_reg1_local->x86Op->argB).field_1.labelID = local_1c;
  _reg1_local->x86Op = _reg1_local->x86Op + 1;
  return;
}

Assistant:

void EMIT_OP_REG_NUM(CodeGenGenericContext &ctx, x86Command op, x86Reg reg1, unsigned num)
{
	if(op == o_movsx)
		op = o_mov;

#ifdef NULLC_OPTIMIZE_X86
	switch(op)
	{
	case o_mov:
		// Skip move if the target already contains the same number
		if(ctx.genReg[reg1].type == x86Argument::argNumber && ctx.genReg[reg1].num == int(num))
		{
			ctx.optimizationCount++;
			return;
		}

		ctx.OverwriteRegisterWithValue(reg1, x86Argument(num));
		break;
	case o_add:
	case o_sub:
	case o_add64:
	case o_sub64:
		// Stack frame setup
		if(reg1 == rESP)
			break;

		ctx.ReadAndModifyRegister(reg1);
		break;
	case o_adc:
	case o_sbb:
	case o_imul:
	case o_and:
	case o_or:
	case o_xor:
	case o_shl:
	case o_sal:
	case o_sar:
	case o_imul64:
	case o_and64:
	case o_or64:
	case o_xor64:
	case o_sal64:
	case o_sar64:
		ctx.ReadAndModifyRegister(reg1);
		break;
	case o_cmp:
	case o_cmp64:
		ctx.ReadRegister(reg1);
		break;
	default:
		assert(!"unknown instruction");
	}
#endif

	ctx.x86Op->name = op;
	ctx.x86Op->argA.type = x86Argument::argReg;
	ctx.x86Op->argA.reg = reg1;
	ctx.x86Op->argB.type = x86Argument::argNumber;
	ctx.x86Op->argB.num = num;
	ctx.x86Op++;
}